

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# star_expression.cpp
# Opt level: O2

void __thiscall
duckdb::StarExpression::StarExpression
          (StarExpression *this,case_insensitive_set_t *exclude_list_p,
          qualified_column_set_t *qualified_set)

{
  __node_base *p_Var1;
  string local_d0;
  QualifiedColumnName local_b0;
  
  (this->super_ParsedExpression).super_BaseExpression.type = STAR;
  (this->super_ParsedExpression).super_BaseExpression.expression_class = STAR;
  (this->super_ParsedExpression).super_BaseExpression.alias._M_dataplus._M_p =
       (pointer)&(this->super_ParsedExpression).super_BaseExpression.alias.field_2;
  (this->super_ParsedExpression).super_BaseExpression.alias._M_string_length = 0;
  (this->super_ParsedExpression).super_BaseExpression.alias.field_2._M_local_buf[0] = '\0';
  (this->super_ParsedExpression).super_BaseExpression.query_location.index = 0xffffffffffffffff;
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)&PTR__StarExpression_027a75a0;
  (this->relation_name)._M_dataplus._M_p = (pointer)&(this->relation_name).field_2;
  (this->relation_name)._M_string_length = 0;
  (this->relation_name).field_2._M_local_buf[0] = '\0';
  ::std::
  _Hashtable<duckdb::QualifiedColumnName,_duckdb::QualifiedColumnName,_std::allocator<duckdb::QualifiedColumnName>,_std::__detail::_Identity,_duckdb::QualifiedColumnEquality,_duckdb::QualifiedColumnHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable(&(this->exclude_list)._M_h,&qualified_set->_M_h);
  (this->replace_list)._M_h._M_buckets = &(this->replace_list)._M_h._M_single_bucket;
  (this->replace_list)._M_h._M_bucket_count = 1;
  (this->replace_list)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->replace_list)._M_h._M_element_count = 0;
  (this->replace_list)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->replace_list)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->replace_list)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->rename_list)._M_h._M_buckets = &(this->rename_list)._M_h._M_single_bucket;
  (this->rename_list)._M_h._M_bucket_count = 1;
  (this->rename_list)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->rename_list)._M_h._M_element_count = 0;
  (this->rename_list)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  p_Var1 = &(exclude_list_p->_M_h)._M_before_begin;
  (this->rename_list)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->rename_list)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  *(undefined8 *)((long)&(this->rename_list)._M_h._M_single_bucket + 1) = 0;
  *(undefined8 *)
   ((long)&(this->expr).
           super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false> + 1) = 0;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    ::std::__cxx11::string::string((string *)&local_d0,(string *)(p_Var1 + 1));
    QualifiedColumnName::QualifiedColumnName(&local_b0,&local_d0);
    ::std::__detail::
    _Insert<duckdb::QualifiedColumnName,_duckdb::QualifiedColumnName,_std::allocator<duckdb::QualifiedColumnName>,_std::__detail::_Identity,_duckdb::QualifiedColumnEquality,_duckdb::QualifiedColumnHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
    ::insert((_Insert<duckdb::QualifiedColumnName,_duckdb::QualifiedColumnName,_std::allocator<duckdb::QualifiedColumnName>,_std::__detail::_Identity,_duckdb::QualifiedColumnEquality,_duckdb::QualifiedColumnHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
              *)&this->exclude_list,&local_b0);
    QualifiedColumnName::~QualifiedColumnName(&local_b0);
    ::std::__cxx11::string::~string((string *)&local_d0);
  }
  return;
}

Assistant:

StarExpression::StarExpression(const case_insensitive_set_t &exclude_list_p, qualified_column_set_t qualified_set)
    : ParsedExpression(ExpressionType::STAR, ExpressionClass::STAR), exclude_list(std::move(qualified_set)) {
	for (auto &entry : exclude_list_p) {
		exclude_list.insert(QualifiedColumnName(entry));
	}
}